

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O1

idx_t __thiscall duckdb::ZSTDCompressionState::NewSegment(ZSTDCompressionState *this)

{
  optional_ptr<duckdb::FileBuffer,_true> *this_00;
  pointer pCVar1;
  RowGroup *pRVar2;
  InternalException *this_01;
  ulong uVar3;
  idx_t iVar4;
  string local_50;
  
  if ((this->current_buffer).ptr != &this->segment_handle) {
    if ((this->segment).
        super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
        super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
        .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl == (ColumnSegment *)0x0)
    {
      pRVar2 = ColumnDataCheckpointData::GetRowGroup(this->checkpoint_data);
      iVar4 = (pRVar2->super_SegmentBase<duckdb::RowGroup>).start;
    }
    else {
      pCVar1 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->segment);
      iVar4 = (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start;
      pCVar1 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->segment);
      iVar4 = (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i + iVar4;
      FlushSegment(this);
    }
    CreateEmptySegment(this,iVar4);
    if (this->segment_count + 1 < this->total_segment_count) {
      iVar4 = this->vectors_per_segment;
    }
    else {
      iVar4 = this->total_vector_count - this->vector_count;
    }
    this_00 = &(this->segment_handle).node;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
    this->page_ids = (page_id_t *)((this->segment_handle).node.ptr)->buffer;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
    this->page_offsets = (page_offset_t *)(((this->segment_handle).node.ptr)->buffer + iVar4 * 8);
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
    this->uncompressed_sizes =
         (uncompressed_size_t *)
         (((this->segment_handle).node.ptr)->buffer + (iVar4 * 0xc + 7 & 0xfffffffffffffff8));
    uVar3 = iVar4 * 0x14 + 7 & 0xfffffffffffffff8;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(this_00);
    this->compressed_sizes =
         (compressed_size_t *)(((this->segment_handle).node.ptr)->buffer + uVar3);
    return uVar3 + iVar4 * 8;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "We are asking for a new segment, but somehow we\'re still writing vector data onto the initial (segment) page"
             ,"");
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t NewSegment() {
		if (current_buffer == &segment_handle) {
			// This should never happen, the string lengths + vector metadata size should always exceed a page size,
			// even if the strings are all empty
			throw InternalException("We are asking for a new segment, but somehow we're still writing vector data onto "
			                        "the initial (segment) page");
		}
		idx_t row_start;
		if (segment) {
			row_start = segment->start + segment->count;
			FlushSegment();
		} else {
			row_start = checkpoint_data.GetRowGroup().start;
		}
		CreateEmptySegment(row_start);

		// Figure out how many vectors we are storing in this segment
		idx_t vectors_in_segment;
		if (segment_count + 1 >= total_segment_count) {
			vectors_in_segment = total_vector_count - vector_count;
		} else {
			vectors_in_segment = vectors_per_segment;
		}

		idx_t offset = 0;
		page_ids = reinterpret_cast<page_id_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(page_id_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(page_offset_t)>(offset);
		page_offsets = reinterpret_cast<page_offset_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(page_offset_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(uncompressed_size_t)>(offset);
		uncompressed_sizes = reinterpret_cast<uncompressed_size_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(uncompressed_size_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(compressed_size_t)>(offset);
		compressed_sizes = reinterpret_cast<compressed_size_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(compressed_size_t) * vectors_in_segment);

		D_ASSERT(offset == GetVectorMetadataSize(vectors_in_segment));
		return offset;
	}